

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSS.cpp
# Opt level: O0

void __thiscall NaPNStateSpace::action(NaPNStateSpace *this)

{
  int iVar1;
  int iVar2;
  undefined4 *puVar3;
  NaVector *pNVar4;
  long in_RDI;
  NaPetriCnInput *in_stack_ffffffffffffffe8;
  long *plVar5;
  
  if (*(long *)(in_RDI + 0x1f0) == 0) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0;
    __cxa_throw(puVar3,&NaException::typeinfo,0);
  }
  if ((*(byte *)(in_RDI + 0x3a) & 1) != 0) {
    NaPrintLog(
              "           *************************\n           * Internal state change *\n           *************************\n"
              );
    NaPrintLog("### x(t): ");
    pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x170));
    (*pNVar4->_vptr_NaVector[0x1f])();
    NaPrintLog("### y(t): ");
    pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0xf0));
    (*pNVar4->_vptr_NaVector[0x1f])();
  }
  plVar5 = *(long **)(in_RDI + 0x1f0);
  pNVar4 = NaPetriCnInput::data(in_stack_ffffffffffffffe8);
  iVar1 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
  pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0xf0));
  iVar2 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
  (**(code **)(*plVar5 + 0x30))(plVar5,iVar1,iVar2);
  plVar5 = *(long **)(in_RDI + 0x1f0);
  pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x170));
  (**(code **)(*plVar5 + 0xb8))(plVar5,pNVar4);
  if ((*(byte *)(in_RDI + 0x3a) & 1) != 0) {
    NaPrintLog("### x(t+1): ");
    pNVar4 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x170));
    (*pNVar4->_vptr_NaVector[0x1f])();
  }
  return;
}

Assistant:

void
NaPNStateSpace::action ()
{
    if(NULL == m_pSSModel){
      throw(na_null_pointer);
    }

    //           *************************
    //           * Internal state change *
    //           *************************

    if(bVerbose){
        NaPrintLog("           *************************\n"
                   "           * Internal state change *\n"
                   "           *************************\n");

        NaPrintLog("### x(t): ");
        x.data().print_contents();

        NaPrintLog("### y(t): ");
        y.data().print_contents();
    }

    m_pSSModel->Function(&u.data()[0], &y.data()[0]);
    m_pSSModel->GetState(x.data());

    if(bVerbose){
        NaPrintLog("### x(t+1): ");
        x.data().print_contents();
    }
}